

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

string * __thiscall
duckdb::GetSeparator_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,string_t *input)

{
  bool bVar1;
  pointer pFVar2;
  pointer *__ptr;
  string option;
  string system_sep;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_58;
  string local_50;
  string local_30 [32];
  
  string_t::GetString_abi_cxx11_(&local_50,(string_t *)this);
  FileSystem::CreateLocal();
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_58);
  (*pFVar2->_vptr_FileSystem[0x19])(local_30,pFVar2,&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = ::std::operator==(&local_50,"system");
  if (bVar1) {
    ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = ::std::operator==(&local_50,"forward_slash");
    if (!bVar1) {
      ::std::operator==(&local_50,"backslash");
    }
    ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string(local_30);
  if (local_58._M_head_impl != (FileSystem *)0x0) {
    (*(local_58._M_head_impl)->_vptr_FileSystem[1])();
  }
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static string GetSeparator(const string_t &input) {
	string option = input.GetString();

	// system's path separator
	auto fs = FileSystem::CreateLocal();
	auto system_sep = fs->PathSeparator(option);

	string separator;
	if (option == "system") {
		separator = system_sep;
	} else if (option == "forward_slash") {
		separator = "/";
	} else if (option == "backslash") {
		separator = "\\";
	} else { // both_slash (default)
		separator = "/\\";
	}
	return separator;
}